

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O1

void fallbackSort(UInt32 *fmap,UInt32 *eclass,UInt32 *bhtab,Int32 nblock,Int32 verb)

{
  uint uVar1;
  undefined4 uVar2;
  UInt32 UVar3;
  bool bVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint *puVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  UInt32 *pUVar26;
  uint uVar27;
  UInt32 UVar28;
  uint uVar29;
  ulong uVar30;
  Int32 zztmp_1;
  ulong uVar31;
  long lVar32;
  uint uVar33;
  Int32 stackLo [100];
  Int32 ftab [257];
  Int32 ftabCopy [256];
  uint local_bbc;
  ulong local_ba0;
  uint local_b68 [99];
  uint auStack_9dc [101];
  int local_848 [260];
  int local_438 [258];
  
  if (3 < verb) {
    fallbackSort_cold_1();
  }
  uVar6 = (ulong)(uint)nblock;
  memset(local_848,0,0x404);
  if (0 < nblock) {
    uVar11 = 0;
    do {
      local_848[*(byte *)((long)eclass + uVar11)] = local_848[*(byte *)((long)eclass + uVar11)] + 1;
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
  }
  memcpy(local_438,local_848,0x400);
  lVar12 = 1;
  do {
    local_848[0] = local_848[0] + local_848[lVar12];
    local_848[lVar12] = local_848[0];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x101);
  if (0 < nblock) {
    uVar11 = 0;
    do {
      iVar17 = local_848[*(byte *)((long)eclass + uVar11)];
      local_848[*(byte *)((long)eclass + uVar11)] = iVar17 + -1;
      fmap[(long)iVar17 + -1] = (UInt32)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
  }
  if (-0x40 < nblock) {
    iVar17 = nblock + 0x1f;
    if (-1 < nblock) {
      iVar17 = nblock;
    }
    iVar15 = -1;
    if (-1 < iVar17 >> 5) {
      iVar15 = iVar17 >> 5;
    }
    memset(bhtab,0,(ulong)(iVar15 + 1) * 4 + 4);
  }
  lVar12 = 0;
  do {
    bhtab[local_848[lVar12] >> 5] =
         bhtab[local_848[lVar12] >> 5] | 1 << ((byte)local_848[lVar12] & 0x1f);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x100);
  iVar17 = 0;
  do {
    bhtab[nblock + iVar17 >> 5] =
         bhtab[nblock + iVar17 >> 5] | 1 << ((byte)(nblock + iVar17) & 0x1f);
    iVar15 = nblock + 1 + iVar17;
    bVar5 = (byte)iVar15 & 0x1f;
    bhtab[iVar15 >> 5] = bhtab[iVar15 >> 5] & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
    iVar17 = iVar17 + 2;
  } while (iVar17 != 0x40);
  local_bbc = 1;
  do {
    if (3 < verb) {
      fprintf(_stderr,"        depth %6d has ",(ulong)local_bbc);
    }
    if (0 < nblock) {
      uVar11 = 0;
      uVar16 = 0;
      do {
        if ((bhtab[uVar11 >> 5 & 0x7ffffff] >> ((uint)uVar11 & 0x1f) & 1) != 0) {
          uVar16 = uVar11 & 0xffffffff;
        }
        eclass[(int)(((int)(fmap[uVar11] - local_bbc) >> 0x1f & nblock) + (fmap[uVar11] - local_bbc)
                    )] = (UInt32)uVar16;
        uVar11 = uVar11 + 1;
      } while (uVar6 != uVar11);
    }
    uVar33 = 0;
    iVar17 = 0;
LAB_0019dd97:
    iVar15 = uVar33 - 0x20;
    uVar18 = uVar33 - 1;
    do {
      uVar10 = uVar18;
      iVar8 = iVar15;
      uVar20 = uVar33;
      uVar21 = 1 << (sbyte)(uVar20 & 0x1f) & bhtab[(int)uVar20 >> 5];
      if ((uVar20 & 0x1f) == 0) break;
      uVar33 = uVar20 + 1;
      iVar15 = iVar8 + 1;
      uVar18 = uVar10 + 1;
    } while (uVar21 != 0);
    if (uVar21 != 0) {
      do {
        uVar20 = uVar10;
        iVar8 = iVar8 + 0x20;
        uVar10 = uVar20 + 0x20;
      } while (bhtab[iVar8 >> 5] == 0xffffffff);
      do {
        uVar20 = uVar20 + 1;
      } while ((bhtab[(int)uVar20 >> 5] >> (uVar20 & 0x1f) & 1) != 0);
    }
    if ((int)uVar20 <= nblock) {
      uVar21 = uVar20 - 1;
      uVar18 = uVar20;
      iVar15 = uVar20 - 0x20;
      uVar10 = uVar21;
      do {
        uVar1 = uVar10;
        iVar8 = iVar15;
        uVar33 = uVar18;
        uVar22 = 1 << (sbyte)(uVar33 & 0x1f) & bhtab[(int)uVar33 >> 5];
        if ((uVar33 & 0x1f) == 0) break;
        uVar18 = uVar33 + 1;
        iVar15 = iVar8 + 1;
        uVar10 = uVar1 + 1;
      } while (uVar22 == 0);
      if (uVar22 == 0) {
        do {
          uVar33 = uVar1;
          iVar8 = iVar8 + 0x20;
          uVar1 = uVar33 + 0x20;
        } while (bhtab[iVar8 >> 5] == 0);
        do {
          uVar33 = uVar33 + 1;
        } while ((bhtab[(int)uVar33 >> 5] >> (uVar33 & 0x1f) & 1) == 0);
      }
      if (nblock < (int)uVar33) goto LAB_0019e2b8;
      if ((int)uVar20 < (int)uVar33) {
        iVar17 = (iVar17 - uVar20) + uVar33 + 1;
        auStack_9dc[1] = uVar21;
        local_b68[0] = uVar33 - 1;
        local_ba0 = 1;
        uVar18 = 0;
        do {
          uVar11 = local_ba0 & 0xffffffff;
          while( true ) {
            if (0x62 < (long)uVar11) {
              BZ2_bz__AssertH__fail(0x3ec);
            }
            local_ba0 = uVar11 - 1;
            uVar10 = auStack_9dc[uVar11];
            lVar12 = (long)(int)uVar10;
            uVar1 = local_b68[uVar11 - 1];
            uVar16 = (ulong)uVar1;
            if (9 < (int)(uVar1 - uVar10)) break;
            if (uVar1 != uVar10) {
              lVar19 = (long)(int)uVar1;
              if ((int)uVar10 <= (int)(uVar1 - 4) && 3 < (int)(uVar1 - uVar10)) {
                lVar25 = (long)(int)(uVar1 - 4);
                lVar32 = lVar19;
                do {
                  UVar28 = fmap[lVar25];
                  iVar15 = (int)lVar25;
                  if (lVar25 <= lVar19 + -4) {
                    uVar22 = eclass[(int)UVar28];
                    lVar7 = lVar32;
                    lVar24 = lVar25;
                    do {
                      lVar13 = lVar7;
                      iVar15 = (int)lVar24;
                      if (uVar22 <= eclass[fmap[lVar13]]) goto LAB_0019df6f;
                      fmap[iVar15] = fmap[lVar13];
                      lVar7 = lVar13 + 4;
                      lVar24 = lVar13;
                    } while (lVar13 + 4 <= lVar19);
                    iVar15 = (int)lVar13;
                  }
LAB_0019df6f:
                  fmap[iVar15] = UVar28;
                  lVar32 = lVar32 + -1;
                  bVar4 = lVar12 < lVar25;
                  lVar25 = lVar25 + -1;
                } while (bVar4);
              }
              if ((int)uVar10 < (int)uVar1) {
                iVar15 = -uVar1;
                pUVar26 = fmap + lVar19;
                iVar8 = 1;
                lVar25 = lVar19;
                do {
                  UVar28 = fmap[lVar25 + -1];
                  iVar23 = (int)lVar25;
                  if (lVar25 <= lVar19) {
                    uVar10 = eclass[(int)UVar28];
                    lVar32 = 0;
                    do {
                      if (uVar10 <= eclass[pUVar26[lVar32]]) {
                        iVar23 = (int)lVar32 - iVar15;
                        break;
                      }
                      pUVar26[lVar32 + -1] = pUVar26[lVar32];
                      lVar32 = lVar32 + 1;
                      iVar23 = uVar1 + 1;
                    } while (iVar8 != (int)lVar32);
                  }
                  lVar25 = lVar25 + -1;
                  fmap[(long)iVar23 + -1] = UVar28;
                  iVar15 = iVar15 + 1;
                  iVar8 = iVar8 + 1;
                  pUVar26 = pUVar26 + -1;
                } while (lVar12 < lVar25);
              }
            }
            bVar4 = (long)uVar11 < 2;
            uVar11 = local_ba0;
            if (bVar4) goto LAB_0019e25c;
          }
          uVar18 = uVar18 * 0x1dc5 + 1 & 0x7fff;
          uVar22 = uVar10;
          if ((uVar18 % 3 != 0) && (uVar22 = uVar1, uVar18 % 3 == 1)) {
            uVar22 = (int)(uVar1 + uVar10) >> 1;
          }
          UVar28 = eclass[fmap[(int)uVar22]];
          uVar31 = (ulong)uVar10;
          uVar30 = uVar16;
          uVar22 = uVar10;
LAB_0019e052:
          uVar29 = (uint)uVar16;
          if ((int)uVar22 <= (int)uVar29) {
            uVar31 = (ulong)(int)uVar31;
            uVar27 = uVar22;
            do {
              lVar19 = (long)(int)uVar27 + -1;
              uVar22 = uVar27;
              while( true ) {
                uVar9 = fmap[lVar19 + 1];
                UVar3 = eclass[uVar9];
                if (UVar3 == UVar28) break;
                if (UVar3 != UVar28 && (int)UVar28 <= (int)UVar3) goto LAB_0019e0b8;
                uVar22 = uVar22 + 1;
                lVar19 = lVar19 + 1;
                if ((int)uVar29 <= lVar19) {
                  if ((int)uVar27 <= (int)uVar29) {
                    uVar27 = uVar29;
                  }
                  uVar22 = uVar27 + 1;
                  goto LAB_0019e0b8;
                }
              }
              fmap[lVar19 + 1] = fmap[uVar31];
              fmap[uVar31] = uVar9;
              uVar31 = uVar31 + 1;
              uVar27 = uVar22 + 1;
            } while ((int)uVar22 < (int)uVar29);
            uVar22 = uVar22 + 1;
          }
LAB_0019e0b8:
          lVar19 = (long)(int)uVar22;
          if ((int)uVar22 <= (int)uVar29) {
            uVar30 = (ulong)(int)uVar30;
            do {
              uVar29 = (uint)uVar16;
              lVar25 = (long)(int)uVar29 + 1;
              while( true ) {
                uVar27 = fmap[lVar25 + -1];
                iVar15 = (int)uVar16;
                if (eclass[uVar27] == UVar28) break;
                if ((int)eclass[uVar27] < (int)UVar28) {
                  UVar3 = fmap[lVar19];
                  fmap[lVar19] = uVar27;
                  fmap[lVar25 + -1] = UVar3;
                  uVar22 = uVar22 + 1;
                  uVar16 = (ulong)(iVar15 - 1);
                  goto LAB_0019e052;
                }
                lVar25 = lVar25 + -1;
                uVar16 = (ulong)(iVar15 - 1);
                if (lVar25 <= lVar19) {
                  if (lVar19 <= (int)uVar29) {
                    uVar29 = uVar22;
                  }
                  uVar29 = uVar29 - 1;
                  goto LAB_0019e14c;
                }
              }
              fmap[lVar25 + -1] = fmap[uVar30];
              fmap[uVar30] = uVar27;
              uVar30 = uVar30 - 1;
              uVar16 = (ulong)(iVar15 - 1);
            } while ((int)uVar22 < iVar15);
            uVar29 = iVar15 - 1;
          }
LAB_0019e14c:
          iVar15 = (int)uVar30;
          uVar27 = (uint)uVar31;
          if ((int)uVar27 <= iVar15) {
            iVar8 = uVar22 - uVar27;
            if ((int)(uVar27 - uVar10) < (int)(uVar22 - uVar27)) {
              iVar8 = uVar27 - uVar10;
            }
            if (0 < iVar8) {
              iVar23 = iVar8 + 1;
              lVar25 = 0;
              do {
                uVar2 = *(undefined4 *)((long)fmap + lVar25 + lVar12 * 4);
                *(undefined4 *)((long)fmap + lVar25 + lVar12 * 4) =
                     *(undefined4 *)((long)fmap + lVar25 + (long)(int)(uVar22 - iVar8) * 4);
                *(undefined4 *)((long)fmap + lVar25 + (long)(int)(uVar22 - iVar8) * 4) = uVar2;
                lVar25 = lVar25 + 4;
                iVar23 = iVar23 + -1;
              } while (1 < iVar23);
            }
            iVar23 = iVar15 - uVar29;
            iVar8 = uVar1 - iVar15;
            if (iVar23 <= (int)(uVar1 - iVar15)) {
              iVar8 = iVar23;
            }
            if (0 < iVar8) {
              iVar15 = iVar8 + 1;
              pUVar26 = fmap;
              do {
                UVar28 = pUVar26[lVar19];
                pUVar26[lVar19] = pUVar26[(long)(int)(uVar1 - iVar8) + 1];
                pUVar26[(long)(int)(uVar1 - iVar8) + 1] = UVar28;
                pUVar26 = pUVar26 + 1;
                iVar15 = iVar15 + -1;
              } while (1 < iVar15);
            }
            uVar29 = ~uVar27 + uVar10 + uVar22;
            uVar9 = (uVar1 - iVar23) + 1;
            if ((int)(uVar1 - uVar9) < (int)(~uVar27 + uVar22)) {
              local_b68[local_ba0] = uVar29;
              uVar10 = uVar9;
              uVar29 = uVar1;
            }
            else {
              auStack_9dc[uVar11] = uVar9;
            }
            auStack_9dc[(uVar11 & 0xffffffff) + 1] = uVar10;
            local_b68[uVar11 & 0xffffffff] = uVar29;
            local_ba0 = (ulong)((int)uVar11 + 1);
          }
        } while (0 < (int)local_ba0);
LAB_0019e25c:
        if ((int)uVar20 <= (int)uVar33) {
          puVar14 = fmap + (int)uVar21;
          UVar28 = 0xffffffff;
          do {
            UVar3 = eclass[*puVar14];
            if (UVar28 != UVar3) {
              bhtab[(int)uVar21 >> 5] = bhtab[(int)uVar21 >> 5] | 1 << ((byte)uVar21 & 0x1f);
              UVar28 = UVar3;
            }
            uVar21 = uVar21 + 1;
            puVar14 = puVar14 + 1;
          } while (uVar33 != uVar21);
        }
      }
      goto LAB_0019dd97;
    }
LAB_0019e2b8:
    if (3 < verb) {
      fprintf(_stderr,"%6d unresolved strings\n");
    }
    local_bbc = local_bbc * 2;
    if ((nblock < (int)local_bbc) || (iVar17 == 0)) {
      if (3 < verb) {
        fallbackSort_cold_2();
      }
      if (0 < nblock) {
        uVar11 = 0;
        lVar12 = 0;
        do {
          lVar12 = (long)(int)lVar12 + -1;
          do {
            lVar19 = lVar12 + 1;
            lVar12 = lVar12 + 1;
          } while (local_438[lVar19] == 0);
          local_438[lVar12] = local_438[lVar19] + -1;
          *(char *)((long)eclass + (ulong)fmap[uVar11]) = (char)lVar12;
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar6);
        if (0xff < lVar12) {
          BZ2_bz__AssertH__fail(0x3ed);
          return;
        }
      }
      return;
    }
  } while( true );
}

Assistant:

static
void fallbackSort ( UInt32* fmap, 
                    UInt32* eclass, 
                    UInt32* bhtab,
                    Int32   nblock,
                    Int32   verb )
{
   Int32 ftab[257];
   Int32 ftabCopy[256];
   Int32 H, i, j, k, l, r, cc, cc1;
   Int32 nNotDone;
   Int32 nBhtab;
   UChar* eclass8 = (UChar*)eclass;

   /*--
      Initial 1-char radix sort to generate
      initial fmap and initial BH bits.
   --*/
   if (verb >= 4)
      VPrintf0 ( "        bucket sorting ...\n" );
   for (i = 0; i < 257;    i++) ftab[i] = 0;
   for (i = 0; i < nblock; i++) ftab[eclass8[i]]++;
   for (i = 0; i < 256;    i++) ftabCopy[i] = ftab[i];
   for (i = 1; i < 257;    i++) ftab[i] += ftab[i-1];

   for (i = 0; i < nblock; i++) {
      j = eclass8[i];
      k = ftab[j] - 1;
      ftab[j] = k;
      fmap[k] = i;
   }

   nBhtab = 2 + (nblock / 32);
   for (i = 0; i < nBhtab; i++) bhtab[i] = 0;
   for (i = 0; i < 256; i++) SET_BH(ftab[i]);

   /*--
      Inductively refine the buckets.  Kind-of an
      "exponential radix sort" (!), inspired by the
      Manber-Myers suffix array construction algorithm.
   --*/

   /*-- set sentinel bits for block-end detection --*/
   for (i = 0; i < 32; i++) { 
      SET_BH(nblock + 2*i);
      CLEAR_BH(nblock + 2*i + 1);
   }

   /*-- the log(N) loop --*/
   H = 1;
   while (1) {

      if (verb >= 4) 
         VPrintf1 ( "        depth %6d has ", H );

      j = 0;
      for (i = 0; i < nblock; i++) {
         if (ISSET_BH(i)) j = i;
         k = fmap[i] - H; if (k < 0) k += nblock;
         eclass[k] = j;
      }

      nNotDone = 0;
      r = -1;
      while (1) {

	 /*-- find the next non-singleton bucket --*/
         k = r + 1;
         while (ISSET_BH(k) && UNALIGNED_BH(k)) k++;
         if (ISSET_BH(k)) {
            while (WORD_BH(k) == 0xffffffff) k += 32;
            while (ISSET_BH(k)) k++;
         }
         l = k - 1;
         if (l >= nblock) break;
         while (!ISSET_BH(k) && UNALIGNED_BH(k)) k++;
         if (!ISSET_BH(k)) {
            while (WORD_BH(k) == 0x00000000) k += 32;
            while (!ISSET_BH(k)) k++;
         }
         r = k - 1;
         if (r >= nblock) break;

         /*-- now [l, r] bracket current bucket --*/
         if (r > l) {
            nNotDone += (r - l + 1);
            fallbackQSort3 ( fmap, eclass, l, r );

            /*-- scan bucket and generate header bits-- */
            cc = -1;
            for (i = l; i <= r; i++) {
               cc1 = eclass[fmap[i]];
               if (cc != cc1) { SET_BH(i); cc = cc1; };
            }
         }
      }

      if (verb >= 4) 
         VPrintf1 ( "%6d unresolved strings\n", nNotDone );

      H *= 2;
      if (H > nblock || nNotDone == 0) break;
   }

   /*-- 
      Reconstruct the original block in
      eclass8 [0 .. nblock-1], since the
      previous phase destroyed it.
   --*/
   if (verb >= 4)
      VPrintf0 ( "        reconstructing block ...\n" );
   j = 0;
   for (i = 0; i < nblock; i++) {
      while (ftabCopy[j] == 0) j++;
      ftabCopy[j]--;
      eclass8[fmap[i]] = (UChar)j;
   }
   AssertH ( j < 256, 1005 );
}